

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

bool __thiscall QLabel::event(QLabel *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  FocusPolicy FVar4;
  Type TVar5;
  QLabelPrivate *this_00;
  QWidget *this_01;
  QAbstractButton *this_02;
  QWidgetPrivate *in_RSI;
  QWidget *unaff_retaddr;
  QAbstractButton *button;
  QWidget *w;
  QShortcutEvent *se;
  bool in_stack_00000023;
  Type type;
  QLabelPrivate *d;
  QLabelPrivate *in_stack_00000058;
  QEvent *in_stack_ffffffffffffffc8;
  QWidgetPrivate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  FocusReason in_stack_fffffffffffffffc;
  
  this_00 = d_func((QLabel *)0x5b0e50);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == Shortcut) {
    iVar3 = QShortcutEvent::shortcutId((QShortcutEvent *)in_RSI);
    if (iVar3 == this_00->shortcutId) {
      this_01 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x5b0ea4);
      if (this_01 != (QWidget *)0x0) {
        FVar4 = QWidget::focusPolicy(this_01);
        if (FVar4 != NoFocus) {
          QWidget::setFocus(unaff_retaddr,in_stack_fffffffffffffffc);
        }
        this_02 = qobject_cast<QAbstractButton*>((QObject *)0x5b0ef2);
        if ((this_02 == (QAbstractButton *)0x0) ||
           (bVar1 = QShortcutEvent::isAmbiguous((QShortcutEvent *)in_RSI), bVar1)) {
          QWidget::window((QWidget *)in_RSI);
          QWidget::setAttribute((QWidget *)d,type,in_stack_00000023);
        }
        else {
          QAbstractButton::animateClick(this_02);
        }
        return true;
      }
      bVar1 = QFrame::event((QFrame *)in_RSI,(QEvent *)0x0);
      return bVar1;
    }
  }
  else if (TVar2 == Resize) {
    in_RSI = in_stack_ffffffffffffffd0;
    if (this_00->control != (QWidgetTextControl *)0x0) {
      *(ushort *)&this_00->field_0x340 = *(ushort *)&this_00->field_0x340 & 0xfffb | 4;
    }
  }
  else {
    TVar5 = QEvent::type((QEvent *)in_RSI);
    if (TVar5 == StyleChange) {
      QWidgetPrivate::setLayoutItemMargins
                (in_RSI,(SubElement)((ulong)this_00 >> 0x20),
                 (QStyleOption *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
      QLabelPrivate::updateLabel((QLabelPrivate *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
      in_RSI = in_stack_ffffffffffffffd0;
    }
    else {
      in_RSI = in_stack_ffffffffffffffd0;
      if ((TVar2 == Polish) &&
         (bVar1 = QLabelPrivate::needTextControl(this_00), in_RSI = in_stack_ffffffffffffffd0, bVar1
         )) {
        QLabelPrivate::ensureTextControl(in_stack_00000058);
        in_RSI = in_stack_ffffffffffffffd0;
      }
    }
  }
  bVar1 = QFrame::event((QFrame *)in_RSI,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

bool QLabel::event(QEvent *e)
{
    Q_D(QLabel);
    QEvent::Type type = e->type();

#ifndef QT_NO_SHORTCUT
    if (type == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            QWidget *w = d->buddy;
            if (!w)
                return QFrame::event(e);
            if (w->focusPolicy() != Qt::NoFocus)
                w->setFocus(Qt::ShortcutFocusReason);
#if QT_CONFIG(abstractbutton)
            QAbstractButton *button = qobject_cast<QAbstractButton *>(w);
            if (button && !se->isAmbiguous())
                button->animateClick();
            else
#endif
                window()->setAttribute(Qt::WA_KeyboardFocusChange);
            return true;
        }
    } else
#endif
    if (type == QEvent::Resize) {
        if (d->control)
            d->textLayoutDirty = true;
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->setLayoutItemMargins(QStyle::SE_LabelLayoutItem);
        d->updateLabel();
    } else if (type == QEvent::Polish) {
        if (d->needTextControl())
            d->ensureTextControl();
    }

    return QFrame::event(e);
}